

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void jinit_color_converter(j_compress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  jpeg_color_converter *pjVar4;
  ulong uVar5;
  code *pcVar6;
  
  pjVar4 = (jpeg_color_converter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x18);
  cinfo->cconvert = pjVar4;
  pjVar4->start_pass = null_method;
  switch(cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1) {
LAB_001186f3:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 9;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    if (cinfo->input_components != rgb_pixelsize[cinfo->in_color_space]) goto LAB_001186f3;
    break;
  case JCS_YCbCr:
    if (cinfo->input_components != 3) goto LAB_001186f3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4) goto LAB_001186f3;
    break;
  default:
    if (cinfo->input_components < 1) goto LAB_001186f3;
  }
  switch(cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    switch(cinfo->in_color_space) {
    case JCS_GRAYSCALE:
    case JCS_YCbCr:
      pcVar6 = grayscale_convert;
      break;
    case JCS_RGB:
    case JCS_EXT_RGB:
    case JCS_EXT_RGBX:
    case JCS_EXT_BGR:
    case JCS_EXT_BGRX:
    case JCS_EXT_XBGR:
    case JCS_EXT_XRGB:
    case JCS_EXT_RGBA:
    case JCS_EXT_BGRA:
    case JCS_EXT_ABGR:
    case JCS_EXT_ARGB:
      iVar3 = jsimd_can_rgb_gray();
      if (iVar3 == 0) {
        pjVar4->start_pass = rgb_ycc_start;
        pcVar6 = rgb_gray_convert;
      }
      else {
        pcVar6 = jsimd_rgb_gray_convert;
      }
      break;
    default:
switchD_00118755_caseD_4:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x1b;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      return;
    }
    goto LAB_0011889d;
  case JCS_RGB:
    if (cinfo->num_components != 3) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    JVar1 = cinfo->in_color_space;
    uVar5 = (ulong)JVar1;
    if ((((0x10c4UL >> (uVar5 & 0x3f) & 1) == 0) || ((0x33c4UL >> (uVar5 & 0x3f) & 1) == 0)) ||
       ((0x144UL >> (uVar5 & 0x3f) & 1) == 0)) {
      if ((JCS_EXT_ARGB < JVar1) || ((0xffc4U >> (JVar1 & (JCS_RGB565|JCS_EXT_ARGB)) & 1) == 0))
      goto switchD_00118755_caseD_4;
      pcVar6 = rgb_rgb_convert;
      goto LAB_0011889d;
    }
    break;
  case JCS_YCbCr:
    if (cinfo->num_components != 3) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    JVar1 = cinfo->in_color_space;
    if (9 < JVar1 - JCS_EXT_RGB) {
      if (JVar1 == JCS_YCbCr) break;
      if (JVar1 != JCS_RGB) goto switchD_00118755_caseD_4;
    }
    iVar3 = jsimd_can_rgb_ycc();
    if (iVar3 == 0) {
      pjVar4->start_pass = rgb_ycc_start;
      pcVar6 = rgb_ycc_convert;
    }
    else {
      pcVar6 = jsimd_rgb_ycc_convert;
    }
    goto LAB_0011889d;
  case JCS_CMYK:
    if (cinfo->num_components != 4) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_CMYK) goto switchD_00118755_caseD_4;
    break;
  case JCS_YCCK:
    if (cinfo->num_components != 4) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_YCCK) {
      if (cinfo->in_color_space != JCS_CMYK) goto switchD_00118755_caseD_4;
      pjVar4->start_pass = rgb_ycc_start;
      pcVar6 = cmyk_ycck_convert;
      goto LAB_0011889d;
    }
    break;
  default:
    if ((cinfo->jpeg_color_space != cinfo->in_color_space) ||
       (cinfo->num_components != cinfo->input_components)) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x1b;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  pcVar6 = null_convert;
LAB_0011889d:
  pjVar4->color_convert = pcVar6;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_converter(j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_color_converter));
  cinfo->cconvert = (struct jpeg_color_converter *)cconvert;
  /* set start_pass to null method until we find out differently */
  cconvert->pub.start_pass = null_method;

  /* Make sure input_components agrees with in_color_space */
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    if (cinfo->input_components != rgb_pixelsize[cinfo->in_color_space])
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_YCbCr:
    if (cinfo->input_components != 3)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  default:                      /* JCS_UNKNOWN can be anything */
    if (cinfo->input_components < 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;
  }

  /* Check num_components, set conversion method based on requested space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_GRAYSCALE)
      cconvert->pub.color_convert = grayscale_convert;
    else if (cinfo->in_color_space == JCS_RGB ||
             cinfo->in_color_space == JCS_EXT_RGB ||
             cinfo->in_color_space == JCS_EXT_RGBX ||
             cinfo->in_color_space == JCS_EXT_BGR ||
             cinfo->in_color_space == JCS_EXT_BGRX ||
             cinfo->in_color_space == JCS_EXT_XBGR ||
             cinfo->in_color_space == JCS_EXT_XRGB ||
             cinfo->in_color_space == JCS_EXT_RGBA ||
             cinfo->in_color_space == JCS_EXT_BGRA ||
             cinfo->in_color_space == JCS_EXT_ABGR ||
             cinfo->in_color_space == JCS_EXT_ARGB) {
      if (jsimd_can_rgb_gray())
        cconvert->pub.color_convert = jsimd_rgb_gray_convert;
      else {
        cconvert->pub.start_pass = rgb_ycc_start;
        cconvert->pub.color_convert = rgb_gray_convert;
      }
    } else if (cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = grayscale_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (rgb_red[cinfo->in_color_space] == 0 &&
        rgb_green[cinfo->in_color_space] == 1 &&
        rgb_blue[cinfo->in_color_space] == 2 &&
        rgb_pixelsize[cinfo->in_color_space] == 3) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else if (cinfo->in_color_space == JCS_RGB ||
               cinfo->in_color_space == JCS_EXT_RGB ||
               cinfo->in_color_space == JCS_EXT_RGBX ||
               cinfo->in_color_space == JCS_EXT_BGR ||
               cinfo->in_color_space == JCS_EXT_BGRX ||
               cinfo->in_color_space == JCS_EXT_XBGR ||
               cinfo->in_color_space == JCS_EXT_XRGB ||
               cinfo->in_color_space == JCS_EXT_RGBA ||
               cinfo->in_color_space == JCS_EXT_BGRA ||
               cinfo->in_color_space == JCS_EXT_ABGR ||
               cinfo->in_color_space == JCS_EXT_ARGB)
      cconvert->pub.color_convert = rgb_rgb_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB ||
        cinfo->in_color_space == JCS_EXT_RGB ||
        cinfo->in_color_space == JCS_EXT_RGBX ||
        cinfo->in_color_space == JCS_EXT_BGR ||
        cinfo->in_color_space == JCS_EXT_BGRX ||
        cinfo->in_color_space == JCS_EXT_XBGR ||
        cinfo->in_color_space == JCS_EXT_XRGB ||
        cinfo->in_color_space == JCS_EXT_RGBA ||
        cinfo->in_color_space == JCS_EXT_BGRA ||
        cinfo->in_color_space == JCS_EXT_ABGR ||
        cinfo->in_color_space == JCS_EXT_ARGB) {
      if (jsimd_can_rgb_ycc())
        cconvert->pub.color_convert = jsimd_rgb_ycc_convert;
      else {
        cconvert->pub.start_pass = rgb_ycc_start;
        cconvert->pub.color_convert = rgb_ycc_convert;
      }
    } else if (cinfo->in_color_space == JCS_YCbCr) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = cmyk_ycck_convert;
    } else if (cinfo->in_color_space == JCS_YCCK) {
#if defined(__mips__)
      if (jsimd_c_can_null_convert())
        cconvert->pub.color_convert = jsimd_c_null_convert;
      else
#endif
        cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:                      /* allow null conversion of JCS_UNKNOWN */
    if (cinfo->jpeg_color_space != cinfo->in_color_space ||
        cinfo->num_components != cinfo->input_components)
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
#if defined(__mips__)
    if (jsimd_c_can_null_convert())
      cconvert->pub.color_convert = jsimd_c_null_convert;
    else
#endif
      cconvert->pub.color_convert = null_convert;
    break;
  }
}